

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O3

HighsStatus
ipxSolutionToHighsSolution
          (HighsOptions *options,HighsLp *lp,vector<double,_std::allocator<double>_> *rhs,
          vector<char,_std::allocator<char>_> *constraint_type,HighsInt ipx_num_col,
          HighsInt ipx_num_row,vector<double,_std::allocator<double>_> *ipx_x,
          vector<double,_std::allocator<double>_> *ipx_slack_vars,
          vector<double,_std::allocator<double>_> *ipx_y,
          vector<double,_std::allocator<double>_> *ipx_zl,
          vector<double,_std::allocator<double>_> *ipx_zu,HighsModelStatus model_status,
          HighsSolution *highs_solution)

{
  vector<double,_std::allocator<double>_> *this;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  double *pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  int *piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  pointer pdVar12;
  pointer pdVar13;
  pointer piVar14;
  int iVar15;
  ulong uVar16;
  vector<double,_std::allocator<double>_> *pvVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  HighsLogOptions *log_options_;
  long lVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  vector<double,_std::allocator<double>_> final_row_activity;
  vector<double,_std::allocator<double>_> row_activity;
  double local_120;
  double local_118;
  uint local_10c;
  double local_108;
  double local_e8;
  vector<double,_std::allocator<double>_> local_c8;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  vector<double,_std::allocator<double>_> local_88;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  value_type_conflict1 local_38;
  
  this = &highs_solution->col_value;
  std::vector<double,_std::allocator<double>_>::resize(this,(long)lp->num_col_);
  this_00 = &highs_solution->row_value;
  std::vector<double,_std::allocator<double>_>::resize(this_00,(long)lp->num_row_);
  this_01 = &highs_solution->col_dual;
  std::vector<double,_std::allocator<double>_>::resize(this_01,(long)lp->num_col_);
  this_02 = &highs_solution->row_dual;
  std::vector<double,_std::allocator<double>_>::resize(this_02,(long)lp->num_row_);
  local_90 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
  local_a8 = (options->super_HighsOptionsStruct).dual_feasibility_tolerance;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&local_88,(long)lp->num_row_,(value_type_conflict1 *)&local_c8);
  uVar16 = (ulong)lp->num_col_;
  dVar35 = 0.0;
  dVar27 = 0.0;
  if (0 < (long)uVar16) {
    pdVar2 = (ipx_x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (ipx_y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (ipx_zl->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (ipx_zu->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar11 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar24 = 0;
    iVar18 = *piVar4;
    do {
      dVar31 = pdVar2[uVar24];
      dVar30 = pdVar3[uVar24];
      iVar25 = piVar4[uVar24 + 1];
      if (iVar18 < iVar25) {
        lVar20 = (long)iVar18;
        do {
          iVar18 = piVar5[lVar20];
          local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar18] =
               pdVar6[lVar20] * dVar31 +
               local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar18];
          dVar30 = dVar30 - pdVar7[iVar18] * pdVar6[lVar20];
          lVar20 = lVar20 + 1;
        } while (iVar25 != lVar20);
      }
      dVar33 = pdVar8[uVar24] - pdVar9[uVar24];
      pdVar10[uVar24] = dVar31;
      pdVar11[uVar24] = dVar33;
      uVar24 = uVar24 + 1;
      dVar31 = ABS(dVar30 - dVar33);
      if (dVar27 <= dVar31) {
        dVar27 = dVar31;
      }
      iVar18 = iVar25;
    } while (uVar24 != uVar16);
  }
  iVar18 = lp->num_row_;
  if (0 < (long)iVar18) {
    pdVar2 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (rhs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (ipx_slack_vars->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (ipx_y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (ipx_x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (ipx_zl->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar11 = (ipx_zu->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar12 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar13 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    dVar35 = 0.0;
    lVar20 = 0;
    iVar25 = 0;
    do {
      dVar27 = pdVar2[lVar20];
      dVar31 = pdVar3[lVar20];
      if ((-INFINITY < dVar27) || (dVar31 < INFINITY)) {
        if ((dVar27 == -INFINITY) || ((dVar31 == INFINITY || (dVar31 <= dVar27)))) {
          dVar27 = pdVar6[iVar25] - pdVar7[iVar25];
          dVar31 = pdVar8[iVar25];
        }
        else {
          iVar15 = (int)uVar16;
          dVar27 = pdVar9[iVar15];
          dVar31 = pdVar10[iVar15] - pdVar11[iVar15];
          uVar16 = (ulong)(iVar15 + 1);
        }
        if (dVar35 <= ABS(dVar27 - local_88.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar20])) {
          dVar35 = ABS(dVar27 - local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start[lVar20]);
        }
        pdVar12[lVar20] = dVar27;
        pdVar13[lVar20] = dVar31;
        iVar25 = iVar25 + 1;
      }
      else {
        pdVar12[lVar20] =
             local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar20];
        pdVar13[lVar20] = 0.0;
      }
      lVar20 = lVar20 + 1;
    } while (iVar18 != lVar20);
  }
  log_options_ = &(options->super_HighsOptionsStruct).log_options;
  highsLogDev(log_options_,kInfo,
              "ipxSolutionToHighsSolution: Norm of dual residual values is %10.4g\n");
  highsLogDev(log_options_,kInfo,
              "ipxSolutionToHighsSolution: Norm of delta     row values is %10.4g\n",dVar35);
  if (model_status == kOptimal) {
    uVar19 = lp->num_col_;
    uVar16 = (ulong)uVar19;
    iVar18 = lp->num_row_ + uVar19;
    if (iVar18 == 0 || SCARRY4(lp->num_row_,uVar19) != iVar18 < 0) {
      uVar22 = 0;
      local_e8 = 0.0;
      local_120 = 0.0;
      local_118 = 0.0;
      dVar27 = 0.0;
      local_108 = 0.0;
      uVar21 = 0;
      uVar24 = 0;
      local_10c = 0;
    }
    else {
      uVar23 = 0;
      local_10c = 0;
      uVar24 = 0;
      uVar21 = 0;
      uVar22 = 0;
      local_108 = 0.0;
      dVar27 = 0.0;
      local_e8 = 0.0;
      dVar35 = 0.0;
      dVar31 = 0.0;
      do {
        uVar19 = (uint)uVar21;
        local_120 = dVar31;
        local_118 = dVar35;
        if (uVar23 == (uVar16 & 0xffffffff)) {
          local_120 = 0.0;
          local_118 = 0.0;
          uVar21 = 0;
          uVar24 = uVar22;
          uVar22 = 0;
          dVar27 = dVar35;
          local_10c = uVar19;
          local_108 = dVar31;
        }
        lVar20 = (long)(int)uVar16;
        iVar18 = (int)uVar23;
        if ((long)uVar23 < lVar20) {
          dVar30 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar23];
          dVar33 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar23];
          dVar31 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar23];
          dVar35 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar23];
        }
        else {
          iVar18 = iVar18 - (int)uVar16;
          dVar35 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar18];
          dVar31 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar18];
          dVar30 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[iVar18];
          dVar33 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[iVar18];
          if (iVar18 == -0x25) {
            uStack_40 = 0;
            uStack_50 = 0;
            uStack_60 = 0;
            local_a0 = dVar35;
            local_98 = dVar27;
            local_68 = dVar31;
            local_58 = dVar33;
            local_48 = dVar30;
            printf("Row %d\n",0xffffffdb);
            iVar18 = -0x25;
            dVar27 = local_98;
            dVar30 = local_48;
            dVar33 = local_58;
            dVar31 = local_68;
            dVar35 = local_a0;
          }
        }
        if (dVar35 < dVar31) {
          dVar28 = local_90 + dVar35;
          dVar29 = dVar31 - local_90;
          if ((dVar28 < dVar30) || (dVar30 < dVar29)) {
            if (dVar30 <= dVar28) {
              dVar32 = -dVar33;
            }
            else {
              dVar32 = dVar33;
              if (dVar30 < dVar29) {
                dVar32 = ABS(dVar33);
              }
            }
            if (local_a8 < dVar32) {
              dVar34 = dVar30 - dVar31;
              if (dVar30 - dVar31 <= dVar35 - dVar30) {
                dVar34 = dVar35 - dVar30;
              }
              if (dVar32 <= ABS(dVar34)) {
                uVar21 = (ulong)((int)uVar21 + 1);
                dVar35 = dVar30;
                if (dVar30 <= dVar28) {
                  dVar28 = -0.0;
                }
                else {
                  dVar28 = 0.0;
                  if (dVar30 < dVar29) {
                    dVar28 = (double)(~-(ulong)(0.0 < dVar33) & 0x8000000000000000);
                  }
                }
              }
              else {
                uVar22 = (ulong)((int)uVar22 + 1);
                dVar28 = dVar33;
                if (dVar33 <= 0.0) {
                  dVar35 = dVar31;
                  if (dVar31 <= dVar30) {
                    dVar35 = dVar31 + 0.0;
                  }
                }
                else if (dVar35 <= dVar30) {
                  dVar35 = dVar35 + 0.0;
                }
              }
              if (local_118 <= ABS(dVar30 - dVar35)) {
                local_118 = ABS(dVar30 - dVar35);
              }
              if (local_120 <= ABS(dVar33 - dVar28)) {
                local_120 = ABS(dVar33 - dVar28);
              }
              if (local_e8 <= ABS(dVar35)) {
                local_e8 = ABS(dVar35);
              }
              pvVar17 = this_00;
              if ((long)uVar23 < lVar20) {
                pvVar17 = this;
              }
              (pvVar17->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar18] = dVar35;
              pvVar17 = this_02;
              if ((long)uVar23 < lVar20) {
                pvVar17 = this_01;
              }
              (pvVar17->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar18] = dVar28;
            }
          }
        }
        uVar23 = uVar23 + 1;
        uVar16 = (ulong)lp->num_col_;
        dVar35 = local_118;
        dVar31 = local_120;
      } while ((long)uVar23 < (long)((long)lp->num_row_ + uVar16));
    }
    highsLogDev(log_options_,kInfo,
                "ipxSolutionToHighsSolution: Norm of %6d col  primal truncations is %10.4g\n",dVar27
                ,uVar24);
    highsLogDev(log_options_,kInfo,
                "ipxSolutionToHighsSolution: Norm of %6d row  primal truncations is %10.4g\n",
                local_118,uVar22);
    highsLogDev(log_options_,kInfo,
                "ipxSolutionToHighsSolution: Norm of %6d col    dual truncations is %10.4g\n",
                local_108,(ulong)local_10c);
    highsLogDev(log_options_,kInfo,
                "ipxSolutionToHighsSolution: Norm of %6d row    dual truncations is %10.4g\n",
                local_120,uVar21);
    local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&local_c8,(long)lp->num_row_,&local_38);
    iVar18 = lp->num_col_;
    local_120 = 0.0;
    if (0 < (long)iVar18) {
      pdVar2 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar14 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar3 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_120 = 0.0;
      lVar20 = 0;
      iVar25 = *piVar5;
      do {
        dVar27 = pdVar2[lVar20];
        iVar15 = piVar5[lVar20 + 1];
        if (iVar25 < iVar15) {
          lVar26 = (long)iVar25;
          do {
            iVar25 = piVar14[lVar26];
            local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar25] =
                 pdVar3[lVar20] * pdVar6[lVar26] +
                 local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar25];
            dVar27 = dVar27 - pdVar7[iVar25] * pdVar6[lVar26];
            lVar26 = lVar26 + 1;
          } while (iVar15 != lVar26);
        }
        pdVar1 = pdVar8 + lVar20;
        lVar20 = lVar20 + 1;
        dVar27 = ABS(dVar27 - *pdVar1);
        if (local_120 <= dVar27) {
          local_120 = dVar27;
        }
        iVar25 = iVar15;
      } while (lVar20 != iVar18);
    }
    if (0 < (long)lp->num_row_) {
      dVar27 = 0.0;
      lVar20 = 0;
      do {
        dVar35 = ABS(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar20] -
                     (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar20]);
        if (dVar27 <= dVar35) {
          dVar27 = dVar35;
        }
        lVar20 = lVar20 + 1;
      } while (lp->num_row_ != lVar20);
    }
    highsLogDev(log_options_,kInfo,
                "ipxSolutionToHighsSolution: Final norm of primal residual values is %10.4g\n");
    highsLogDev(log_options_,kInfo,
                "ipxSolutionToHighsSolution: Final norm of dual   residual values is %10.4g\n",
                local_120);
    if (1e+25 < local_e8) {
      printf("ipxSolutionToHighsSolution: Excessive corrected |primal value| is %10.4g\n");
    }
    if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (lp->sense_ == kMaximize) {
    iVar18 = lp->num_col_;
    if (0 < (long)iVar18) {
      pdVar2 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar20 = 0;
      do {
        pdVar2[lVar20] = -pdVar2[lVar20];
        lVar20 = lVar20 + 1;
      } while (iVar18 != lVar20);
    }
    iVar18 = lp->num_row_;
    if (0 < (long)iVar18) {
      pdVar2 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar20 = 0;
      do {
        pdVar2[lVar20] = -pdVar2[lVar20];
        lVar20 = lVar20 + 1;
      } while (iVar18 != lVar20);
    }
  }
  highs_solution->value_valid = true;
  highs_solution->dual_valid = true;
  if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return kOk;
}

Assistant:

HighsStatus ipxSolutionToHighsSolution(
    const HighsOptions& options, const HighsLp& lp,
    const std::vector<double>& rhs, const std::vector<char>& constraint_type,
    const HighsInt ipx_num_col, const HighsInt ipx_num_row,
    const std::vector<double>& ipx_x, const std::vector<double>& ipx_slack_vars,
    const std::vector<double>& ipx_y, const std::vector<double>& ipx_zl,
    const std::vector<double>& ipx_zu, const HighsModelStatus model_status,
    HighsSolution& highs_solution) {
  // Resize the HighsSolution
  highs_solution.col_value.resize(lp.num_col_);
  highs_solution.row_value.resize(lp.num_row_);
  highs_solution.col_dual.resize(lp.num_col_);
  highs_solution.row_dual.resize(lp.num_row_);

  const double primal_feasibility_tolerance =
      options.primal_feasibility_tolerance;
  const double dual_feasibility_tolerance = options.dual_feasibility_tolerance;
  const std::vector<double>& ipx_col_value = ipx_x;
  const std::vector<double>& ipx_row_value = ipx_slack_vars;

  // Row activities are needed to set activity values of free rows -
  // which are ignored by IPX
  vector<double> row_activity;
  const bool get_row_activities = true;  // ipx_num_row < lp.num_row_;
  if (get_row_activities) row_activity.assign(lp.num_row_, 0);
  HighsInt ipx_slack = lp.num_col_;
  assert(ipx_num_row == lp.num_row_);
  double dual_residual_norm = 0;
  for (HighsInt col = 0; col < lp.num_col_; col++) {
    double value = ipx_col_value[col];
    if (get_row_activities) {
      // Accumulate row activities to assign value to free rows
      double check_dual = lp.col_cost_[col];
      for (HighsInt el = lp.a_matrix_.start_[col];
           el < lp.a_matrix_.start_[col + 1]; el++) {
        HighsInt row = lp.a_matrix_.index_[el];
        row_activity[row] += value * lp.a_matrix_.value_[el];
        check_dual -= ipx_y[row] * lp.a_matrix_.value_[el];
      }
      double dual_residual =
          std::fabs(check_dual - (ipx_zl[col] - ipx_zu[col]));
      dual_residual_norm = std::max(dual_residual, dual_residual_norm);
    }
    double dual = ipx_zl[col] - ipx_zu[col];
    highs_solution.col_value[col] = value;
    highs_solution.col_dual[col] = dual;
  }
  HighsInt ipx_row = 0;
  ipx_slack = lp.num_col_;
  double delta_norm = 0;
  for (HighsInt row = 0; row < lp.num_row_; row++) {
    double lower = lp.row_lower_[row];
    double upper = lp.row_upper_[row];
    if (lower <= -kHighsInf && upper >= kHighsInf) {
      // Free row - removed by IPX so set it to its row activity
      highs_solution.row_value[row] = row_activity[row];
      highs_solution.row_dual[row] = 0;
      continue;
    }
    // Non-free row, so IPX will have it
    double value = 0;
    double dual = 0;
    if ((lower > -kHighsInf && upper < kHighsInf) && (lower < upper)) {
      assert(constraint_type[ipx_row] == '=');
      // Boxed row - look at its slack
      value = ipx_col_value[ipx_slack];
      dual = ipx_zl[ipx_slack] - ipx_zu[ipx_slack];
      // Update the slack to be used for boxed rows
      ipx_slack++;
    } else {
      value = rhs[ipx_row] - ipx_row_value[ipx_row];
      dual = ipx_y[ipx_row];
    }
    delta_norm = std::max(std::fabs(value - row_activity[row]), delta_norm);
    highs_solution.row_value[row] = value;
    highs_solution.row_dual[row] = dual;
    // Update the IPX row index
    ipx_row++;
  }
  //  if (delta_norm >= dual_feasibility_tolerance)
  highsLogDev(
      options.log_options, HighsLogType::kInfo,
      "ipxSolutionToHighsSolution: Norm of dual residual values is %10.4g\n",
      dual_residual_norm);
  highsLogDev(
      options.log_options, HighsLogType::kInfo,
      "ipxSolutionToHighsSolution: Norm of delta     row values is %10.4g\n",
      delta_norm);
  const bool force_dual_feasibility = false;  // true;
  const bool minimal_truncation = true;
  if (model_status == HighsModelStatus::kOptimal &&
      (force_dual_feasibility || minimal_truncation)) {
    double primal_truncation_norm = 0;
    double dual_truncation_norm = 0;
    double col_primal_truncation_norm = 0;
    double col_dual_truncation_norm = 0;
    HighsInt num_primal_truncations = 0;
    HighsInt num_dual_truncations = 0;
    HighsInt num_col_primal_truncations = 0;
    HighsInt num_col_dual_truncations = 0;
    HighsInt col = 0, row = 0;
    double lower, upper, value, dual;
    const HighsInt check_col = -127;
    const HighsInt check_row = -37;
    // Truncating to tolerances can lead to infeasibilities by margin
    // of machine precision
    const double primal_margin = 0;  // primal_feasibility_tolerance;
    const double dual_margin = 0;    // dual_feasibility_tolerance;
    double max_abs_primal_value = 0;
    for (HighsInt var = 0; var < lp.num_col_ + lp.num_row_; var++) {
      if (var == lp.num_col_) {
        col_primal_truncation_norm = primal_truncation_norm;
        col_dual_truncation_norm = dual_truncation_norm;
        num_col_primal_truncations = num_primal_truncations;
        num_col_dual_truncations = num_dual_truncations;
        primal_truncation_norm = 0;
        dual_truncation_norm = 0;
        num_primal_truncations = 0;
        num_dual_truncations = 0;
      }
      const bool is_col = var < lp.num_col_;
      if (is_col) {
        col = var;
        lower = lp.col_lower_[col];
        upper = lp.col_upper_[col];
        value = highs_solution.col_value[col];
        dual = highs_solution.col_dual[col];
        if (col == check_col) {
          printf("Column %d\n", (int)check_col);
        }
      } else {
        row = var - lp.num_col_;
        lower = lp.row_lower_[row];
        upper = lp.row_upper_[row];
        value = highs_solution.row_value[row];
        dual = highs_solution.row_dual[row];
        if (row == check_row) {
          printf("Row %d\n", (int)check_row);
        }
      }
      // Continue if equality: cannot have dual infeasibility
      if (lower >= upper) continue;
      double dual_truncation = 0;
      double primal_truncation = 0;
      double dual_infeasibility = 0;
      double residual = std::fabs(std::max(lower - value, value - upper));
      double new_value = value;
      double new_dual = dual;
      const bool at_lower = value <= lower + primal_feasibility_tolerance;
      const bool at_upper = value >= upper - primal_feasibility_tolerance;
      // Continue if at distinct bounds: cannot have dual infeasibility
      if (at_lower && at_upper) continue;
      if (at_lower) {
        dual_infeasibility = -dual;
      } else if (at_upper) {
        dual_infeasibility = dual;
      } else {
        dual_infeasibility = std::fabs(dual);
      }
      // Continue if no dual infeasibility
      if (dual_infeasibility <= dual_feasibility_tolerance) continue;

      if (residual < dual_infeasibility && !force_dual_feasibility) {
        /*
          // Residual is less than dual infeasibility, or not forcing
          // dual feasibility, so truncate value
          if (at_lower) {
            assert(10 == 50);
          } else if (at_upper) {
            assert(11 == 50);
          } else {
            // Off bound
            if (lower <= -kHighsInf) {
              if (upper >= kHighsInf) {
                // Free shouldn't be possible, as residual would be inf
                assert(12 == 50);
              } else {
                // Upper bounded, so assume dual is negative
                if (dual > 0) assert(13 == 50);
              }
            } else if (upper >= kHighsInf) {
              // Lower bounded, so assume dual is positive
              if (dual < 0) assert(14 == 50);
            }
          }
        */
        num_primal_truncations++;
        if (dual > 0) {
          // Put closest to lower
          if (value < lower) {
            new_value = lower - primal_margin;
          } else {
            new_value = lower + primal_margin;
          }
        } else {
          // Put closest to upper
          if (value < upper) {
            new_value = upper - primal_margin;
          } else {
            new_value = upper + primal_margin;
          }
        }
      } else {
        // Residual is greater than dual infeasibility, or forcing
        // dual feasibility, so truncate dual
        num_dual_truncations++;
        if (at_lower) {
          // At lower bound, so possibly truncate to -dual_margin
          new_dual = -dual_margin;
        } else if (at_upper) {
          // At upper bound, so possibly truncate to dual_margin
          new_dual = dual_margin;
        } else {
          // Between bounds so possibly set dual to signed dual_margin
          if (dual > 0) {
            new_dual = dual_margin;
          } else {
            new_dual = -dual_margin;
          }
        }
      }
      primal_truncation = std::fabs(value - new_value);
      dual_truncation = std::fabs(dual - new_dual);
      primal_truncation_norm =
          std::max(primal_truncation, primal_truncation_norm);
      dual_truncation_norm = std::max(dual_truncation, dual_truncation_norm);
      /*if (dual_truncation > 1e-2 || primal_truncation > 1e-2)
        printf(
            "%s %4d: [%11.4g, %11.4g, %11.4g] residual = %11.4g; new = %11.4g; "
            "truncation = %11.4g | "
            "dual = %11.4g; new = %11.4g; truncation = %11.4g\n",
            is_col ? "Col" : "Row", (int)(is_col ? col : row), lower, value,
            upper, residual, new_value, primal_truncation, dual, new_dual,
            dual_truncation);
      */
      max_abs_primal_value =
          std::max(std::abs(new_value), max_abs_primal_value);
      if (is_col) {
        highs_solution.col_value[col] = new_value;
        highs_solution.col_dual[col] = new_dual;
      } else {
        highs_solution.row_value[row] = new_value;
        highs_solution.row_dual[row] = new_dual;
      }
    }
    // Assess the truncations
    //  if (dual_truncation_norm >= dual_margin)
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "ipxSolutionToHighsSolution: Norm of %6d col  primal "
                "truncations is %10.4g\n",
                num_col_primal_truncations, col_primal_truncation_norm);
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "ipxSolutionToHighsSolution: Norm of %6d row  primal "
                "truncations is %10.4g\n",
                num_primal_truncations, primal_truncation_norm);
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "ipxSolutionToHighsSolution: Norm of %6d col    dual "
                "truncations is %10.4g\n",
                num_col_dual_truncations, col_dual_truncation_norm);
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "ipxSolutionToHighsSolution: Norm of %6d row    dual "
                "truncations is %10.4g\n",
                num_dual_truncations, dual_truncation_norm);
    // Determine the new residuals

    vector<double> final_row_activity;
    final_row_activity.assign(lp.num_row_, 0);
    dual_residual_norm = 0;
    for (HighsInt col = 0; col < lp.num_col_; col++) {
      double check_dual = lp.col_cost_[col];
      for (HighsInt el = lp.a_matrix_.start_[col];
           el < lp.a_matrix_.start_[col + 1]; el++) {
        HighsInt row = lp.a_matrix_.index_[el];
        final_row_activity[row] +=
            highs_solution.col_value[col] * lp.a_matrix_.value_[el];
        check_dual -= highs_solution.row_dual[row] * lp.a_matrix_.value_[el];
      }
      double dual_residual =
          std::fabs(check_dual - highs_solution.col_dual[col]);
      dual_residual_norm = std::max(dual_residual, dual_residual_norm);
    }
    double primal_residual_norm = 0;
    for (HighsInt row = 0; row < lp.num_row_; row++) {
      double primal_residual =
          std::fabs(final_row_activity[row] - highs_solution.row_value[row]);
      primal_residual_norm = std::max(primal_residual, primal_residual_norm);
    }
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "ipxSolutionToHighsSolution: Final norm of primal residual "
                "values is %10.4g\n",
                primal_residual_norm);
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "ipxSolutionToHighsSolution: Final norm of dual   residual "
                "values is %10.4g\n",
                dual_residual_norm);
    if (max_abs_primal_value > kExcessivePrimalValue) {
      //    highsLogUser(options.log_options, HighsLogType::kInfo,
      printf(
          "ipxSolutionToHighsSolution: "
          "Excessive corrected |primal value| is %10.4g\n",
          max_abs_primal_value);
    }
  }
  assert(ipx_row == ipx_num_row);
  assert(ipx_slack == ipx_num_col);
  if (lp.sense_ == ObjSense::kMaximize) {
    // Flip dual values since original LP is maximization
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
      highs_solution.col_dual[iCol] *= -1;
    for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++)
      highs_solution.row_dual[iRow] *= -1;
  }

  // Indicate that the primal and dual solution are known
  highs_solution.value_valid = true;
  highs_solution.dual_valid = true;
  return HighsStatus::kOk;
}